

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Observer.cpp
# Opt level: O3

void f(int *i)

{
  spin_mutex_t sVar1;
  Task *pTVar2;
  long lVar3;
  ostream *poVar4;
  long *plVar5;
  Workitem *this;
  Task *itask;
  undefined8 *puVar6;
  
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"f begin: ",9);
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," with i=",8);
  plVar5 = (long *)std::ostream::operator<<(poVar4,*i);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  *i = *i + 1;
  if ((depspawn::internal::TP == (Task *)0x0) ||
     (*(char *)&depspawn::internal::TP[10].next == '\x01')) {
    depspawn::internal::start_master();
  }
  this = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                   ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                    depspawn::internal::Workitem::Pool);
  depspawn::internal::Workitem::Workitem(this,(arg_info *)0x0,0);
  pTVar2 = depspawn::internal::TP;
  itask = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                    ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
                     &depspawn::internal::TP[9].next);
  *(undefined8 *)&(itask->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(itask->func_).super__Function_base._M_functor + 8) = 0;
  (itask->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (itask->func_)._M_invoker = (_Invoker_type)0x0;
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = longf;
  *(undefined4 *)(puVar6 + 1) = 0x3fc00000;
  *(undefined8 **)&(itask->func_).super__Function_base._M_functor = puVar6;
  (itask->func_)._M_invoker =
       std::_Function_handler<void_(),_std::_Bind<void_(*(float))(float)>_>::_M_invoke;
  (itask->func_).super__Function_base._M_manager =
       std::_Function_handler<void_(),_std::_Bind<void_(*(float))(float)>_>::_M_manager;
  itask->ctx_ = this;
  itask->next = pTVar2;
  depspawn::internal::Workitem::insert_in_worklist(this,itask);
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"f finish: ",10);
  lVar3 = std::chrono::_V2::system_clock::now();
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," with i=",8);
  plVar5 = (long *)std::ostream::operator<<(poVar4,*i);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void f(int &i) {  
  LOG("f begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
  
  i++;
  
  spawn(longf, 1.5f);

  LOG("f finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}